

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X3DImporter.cpp
# Opt level: O1

void __thiscall
Assimp::X3DImporter::MeshGeometry_AddNormal
          (X3DImporter *this,aiMesh *pMesh,
          list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *pNormals,
          bool pNormalPerVertex)

{
  uint uVar1;
  _List_node_base *p_Var2;
  _List_node_base *p_Var3;
  aiVector3D *paVar4;
  long lVar5;
  runtime_error *prVar6;
  undefined7 in_register_00000009;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  _Self __tmp;
  _List_node_base *p_Var10;
  undefined1 *local_48 [2];
  undefined1 local_38 [16];
  
  p_Var10 = (pNormals->super__List_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
            _M_impl._M_node.super__List_node_base._M_next;
  uVar7 = (pNormals->super__List_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
          _M_impl._M_node._M_size;
  if ((int)CONCAT71(in_register_00000009,pNormalPerVertex) == 0) {
    if (uVar7 != pMesh->mNumFaces) {
      prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_48[0] = local_38;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_48,"MeshGeometry_AddNormal. Normals and faces count must be equal."
                 ,"");
      std::runtime_error::runtime_error(prVar6,(string *)local_48);
      *(undefined ***)prVar6 = &PTR__runtime_error_00896c98;
      __cxa_throw(prVar6,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
    }
    uVar1 = pMesh->mNumVertices;
    paVar4 = (aiVector3D *)operator_new__((ulong)uVar1 * 0xc);
    if (uVar1 != 0) {
      memset(paVar4,0,(((ulong)uVar1 * 0xc - 0xc) / 0xc) * 0xc + 0xc);
    }
    pMesh->mNormals = paVar4;
    if (pMesh->mNumFaces != 0) {
      uVar7 = 0;
      do {
        uVar8 = (ulong)pMesh->mFaces[uVar7].mNumIndices;
        if (uVar8 != 0) {
          uVar9 = 0;
          do {
            paVar4 = pMesh->mNormals;
            uVar1 = pMesh->mFaces[uVar7].mIndices[uVar9];
            paVar4[uVar1].z = *(float *)&p_Var10[1]._M_prev;
            *(_List_node_base **)(paVar4 + uVar1) = p_Var10[1]._M_next;
            uVar9 = uVar9 + 1;
          } while (uVar8 != uVar9);
        }
        p_Var10 = p_Var10->_M_next;
        uVar7 = uVar7 + 1;
      } while (uVar7 < pMesh->mNumFaces);
    }
  }
  else {
    uVar8 = (ulong)pMesh->mNumVertices;
    if (uVar7 != uVar8) {
      prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_48[0] = local_38;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_48,
                 "MeshGeometry_AddNormal. Normals and vertices count must be equal.","");
      std::runtime_error::runtime_error(prVar6,(string *)local_48);
      *(undefined ***)prVar6 = &PTR__runtime_error_00896c98;
      __cxa_throw(prVar6,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
    }
    paVar4 = (aiVector3D *)operator_new__(uVar8 * 0xc);
    if (uVar8 != 0) {
      memset(paVar4,0,((uVar8 * 0xc - 0xc) / 0xc) * 0xc + 0xc);
    }
    pMesh->mNormals = paVar4;
    if (pMesh->mNumVertices != 0) {
      lVar5 = 0;
      uVar7 = 0;
      do {
        p_Var2 = p_Var10[1]._M_next;
        p_Var3 = p_Var10 + 1;
        p_Var10 = p_Var10->_M_next;
        paVar4 = pMesh->mNormals;
        *(undefined4 *)((long)&paVar4->z + lVar5) = *(undefined4 *)&p_Var3->_M_prev;
        *(_List_node_base **)((long)&paVar4->x + lVar5) = p_Var2;
        uVar7 = uVar7 + 1;
        lVar5 = lVar5 + 0xc;
      } while (uVar7 < pMesh->mNumVertices);
    }
  }
  return;
}

Assistant:

void X3DImporter::MeshGeometry_AddNormal(aiMesh& pMesh, const std::list<aiVector3D>& pNormals, const bool pNormalPerVertex) const
{
    std::list<aiVector3D>::const_iterator norm_it = pNormals.begin();

	if(pNormalPerVertex)
	{
		if(pNormals.size() != pMesh.mNumVertices) throw DeadlyImportError("MeshGeometry_AddNormal. Normals and vertices count must be equal.");

		// copy normals to mesh
		pMesh.mNormals = new aiVector3D[pMesh.mNumVertices];
		for(size_t i = 0; i < pMesh.mNumVertices; i++) pMesh.mNormals[i] = *norm_it++;
	}// if(pNormalPerVertex)
	else
	{
		if(pNormals.size() != pMesh.mNumFaces) throw DeadlyImportError("MeshGeometry_AddNormal. Normals and faces count must be equal.");

		// copy normals to mesh
		pMesh.mNormals = new aiVector3D[pMesh.mNumVertices];
		for(size_t fi = 0; fi < pMesh.mNumFaces; fi++)
		{
			// apply color to all vertices of face
			for(size_t vi = 0, vi_e = pMesh.mFaces[fi].mNumIndices; vi < vi_e; vi++) pMesh.mNormals[pMesh.mFaces[fi].mIndices[vi]] = *norm_it;

			++norm_it;
		}
	}// if(pNormalPerVertex) else
}